

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O3

void number_suite::outer_zero_one_fail(void)

{
  bool bVar1;
  chunk_reader reader;
  undefined4 local_164;
  view_type local_160;
  basic_reader<char> local_150;
  
  trial::protocol::json::basic_reader<char>::basic_reader(&local_150);
  local_160._M_len = 1;
  local_160._M_str = "0";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x58,"void number_suite::outer_zero_one_fail()",!bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x59,"void number_suite::outer_zero_one_fail()",&local_160,&local_164);
  local_160._M_len = 2;
  local_160._M_str = "01";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("reader.next(\"01\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x5a,"void number_suite::outer_zero_one_fail()",bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 0xfffffffd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_invalid_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x5b,"void number_suite::outer_zero_one_fail()",&local_160,&local_164);
  if (local_150.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void outer_zero_one_fail()
{
    // "01" is illegal
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(!reader.next("0"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(reader.next("01"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_invalid_value);
}